

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O1

REF_STATUS ref_acceptance_u(REF_NODE ref_node,char *function_name,REF_DBL *scalar)

{
  REF_DBL *pRVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  REF_DBL RVar14;
  double dVar15;
  REF_DBL primitive [5];
  REF_DBL uplus1;
  uint local_9c;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_38;
  
  if (0 < ref_node->max) {
    lVar8 = 2;
    lVar7 = 0;
    do {
      if (-1 < ref_node->global[lVar7]) {
        pRVar1 = ref_node->real;
        RVar14 = pRVar1[lVar8 + -2];
        dVar12 = pRVar1[lVar8 + -1];
        dVar15 = pRVar1[lVar8];
        iVar3 = strcmp(function_name,"u5");
        if (iVar3 == 0) {
          dVar12 = RVar14 * RVar14 + RVar14 * RVar14 + dVar12 * dVar12 + dVar12 * dVar12;
          dVar13 = dVar15 * dVar15 + dVar15 * dVar15;
LAB_00110329:
          RVar14 = dVar13 + dVar12;
LAB_0011032d:
          scalar[lVar7] = RVar14;
        }
        else {
          iVar3 = strcmp(function_name,"supcyl");
          if (iVar3 == 0) {
            dVar15 = RVar14 * RVar14 + dVar12 * dVar12;
            if (dVar15 < 0.0) {
              dVar15 = sqrt(dVar15);
            }
            else {
              dVar15 = SQRT(dVar15);
            }
            dVar15 = exp((dVar15 + -0.5) * -50.0);
            uVar9 = -(ulong)(RVar14 + 1.0 < dVar12 * 0.5 * dVar12);
            scalar[lVar7] =
                 (REF_DBL)(~uVar9 & (ulong)(1.0 - dVar15) |
                          (ulong)((uint)(uVar9 >> 0x20) & 0x40000000) << 0x20);
          }
          else {
            iVar3 = strcmp(function_name,"combo1");
            if (iVar3 == 0) {
              dVar13 = RVar14 + RVar14 + -1.0;
              dVar15 = pow(dVar13,3.0);
              dVar15 = (dVar12 + dVar12 + -1.0) * dVar13 * 15.0 - dVar15;
LAB_00110461:
              dVar15 = tanh(dVar15);
            }
            else {
              iVar3 = strcmp(function_name,"combo2");
              if (iVar3 == 0) {
                dVar15 = (dVar12 + dVar12 + -1.0) * (RVar14 + RVar14 + -1.0) + -0.5;
LAB_00110459:
                dVar15 = dVar15 * 50.0;
                goto LAB_00110461;
              }
              iVar3 = strcmp(function_name,"sin50xy");
              if (iVar3 == 0) {
                dVar15 = (dVar12 + dVar12 + -1.0) * (RVar14 + RVar14 + -1.0);
                dVar12 = dVar15;
                if (dVar15 <= -dVar15) {
                  dVar12 = -dVar15;
                }
                if (dVar12 <= 0.0628318530717958) {
                  dVar15 = sin(dVar15 * 50.0);
                }
                else {
                  dVar15 = sin(dVar15 * 50.0);
                  if (0.1256637061435916 < dVar12) {
                    dVar15 = dVar15 * 0.01;
                  }
                }
              }
              else {
                iVar3 = strcmp(function_name,"sinfun3");
                if (iVar3 != 0) {
                  iVar3 = strcmp(function_name,"sinatan3");
                  if (iVar3 == 0) {
                    dVar15 = RVar14 * dVar15;
                    dVar13 = sin(dVar15 * 50.0);
                    dVar12 = sin(dVar12 * 5.0);
                    dVar12 = atan(0.1 / (dVar12 - (dVar15 + dVar15)));
                    dVar13 = dVar13 * 0.1;
                    goto LAB_00110329;
                  }
                  iVar3 = strcmp(function_name,"tanh3");
                  if (iVar3 == 0) {
                    dVar13 = pow(RVar14 + 1.3,20.0);
                    dVar12 = pow(dVar12 + -0.3,9.0);
                    dVar15 = dVar12 * dVar13 * dVar15;
                    goto LAB_00110461;
                  }
                  iVar3 = strcmp(function_name,"bl3");
                  if (iVar3 == 0) {
                    dVar13 = exp((1.0 - RVar14) / -0.01);
                    dVar12 = exp((1.0 - dVar12) / -0.01);
                    dVar15 = exp((1.0 - dVar15) / -0.01);
                    dVar15 = 1.0 - (1.0 - dVar15) * (1.0 - dVar12) * (1.0 - dVar13);
                    goto LAB_00110466;
                  }
                  iVar3 = strcmp(function_name,"uplus");
                  if (iVar3 == 0) {
                    uVar4 = ref_phys_spalding_uplus(dVar12 * 10000.0,&local_68);
                    if (uVar4 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                             ,0x131,"ref_acceptance_u",(ulong)uVar4,"uplus");
                      return uVar4;
                    }
                    dVar12 = RVar14 * 0.0005 * RVar14 + local_68;
                  }
                  else {
                    iVar3 = strcmp(function_name,"circgap");
                    if (iVar3 == 0) {
                      uVar10 = (undefined4)((ulong)dVar12 >> 0x20);
                      if (dVar12 <= -dVar12) {
                        uVar10 = (undefined4)((ulong)-dVar12 >> 0x20);
                      }
                      uVar4 = ref_phys_spalding_uplus
                                        ((double)CONCAT44(uVar10,SUB84(dVar12,0)) * 10000.0,
                                         &local_68);
                      if (uVar4 == 0) {
                        dVar12 = RVar14 * RVar14 + (dVar12 + 1.1) * (dVar12 + 1.1);
                        if (dVar12 < 0.0) {
                          dVar12 = sqrt(dVar12);
                        }
                        else {
                          dVar12 = SQRT(dVar12);
                        }
                        uVar4 = ref_phys_spalding_uplus((dVar12 + -1.0) * 10000.0,&local_38);
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                 ,0x140,"ref_acceptance_u",(ulong)uVar4,"uplus");
                          local_9c = uVar4;
                          goto LAB_001109cf;
                        }
                        uVar10 = SUB84(local_68,0);
                        uVar11 = (undefined4)((ulong)local_68 >> 0x20);
                        if (local_38 <= local_68) {
                          uVar10 = SUB84(local_38,0);
                          uVar11 = (undefined4)((ulong)local_38 >> 0x20);
                        }
                        iVar3 = (int)(double)CONCAT44(uVar11,uVar10);
                        if (iVar3 < 0x1a) {
                          iVar3 = 0x19;
                        }
                        scalar[lVar7] =
                             (double)(iVar3 + -0x19) * 25.0 + (double)CONCAT44(uVar11,uVar10);
                        bVar2 = true;
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                               ,0x13d,"ref_acceptance_u",(ulong)uVar4,"uplus");
                        local_9c = uVar4;
LAB_001109cf:
                        bVar2 = false;
                      }
                      if (!bVar2) {
                        return local_9c;
                      }
                      goto LAB_0011046c;
                    }
                    iVar3 = strcmp(function_name,"sphuplus");
                    if (iVar3 == 0) {
                      dVar12 = (dVar15 + -1.0) * (dVar15 + -1.0) +
                               (RVar14 + -1.0) * (RVar14 + -1.0) + (dVar12 + -1.0) * (dVar12 + -1.0)
                      ;
                      if (dVar12 < 0.0) {
                        dVar12 = sqrt(dVar12);
                      }
                      else {
                        dVar12 = SQRT(dVar12);
                      }
                      uVar4 = ref_phys_spalding_uplus((dVar12 + -0.5) * 10000.0,&local_68);
                      if (uVar4 != 0) {
                        uVar5 = 0x14d;
LAB_0011093b:
                        pcVar6 = "uplus";
LAB_0011094c:
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                               ,uVar5,"ref_acceptance_u",(ulong)uVar4,pcVar6);
                        local_9c = uVar4;
                      }
                    }
                    else {
                      iVar3 = strcmp(function_name,"cyluplus");
                      if (iVar3 != 0) {
                        iVar3 = strcmp(function_name,"dist");
                        if (iVar3 == 0) {
                          dVar15 = RVar14 * RVar14 + dVar12 * dVar12;
                          if (dVar15 < 0.0) {
                            dVar15 = sqrt(dVar15);
                          }
                          else {
                            dVar15 = SQRT(dVar15);
                          }
                          dVar15 = dVar15 + -0.5;
                          goto LAB_00110466;
                        }
                        iVar3 = strcmp(function_name,"parabola");
                        if (iVar3 == 0) {
                          dVar15 = RVar14 - dVar12 * dVar12;
                          goto LAB_00110459;
                        }
                        iVar3 = strcmp(function_name,"one");
                        if (iVar3 == 0) {
                          RVar14 = 1.0;
                        }
                        else {
                          iVar3 = strcmp(function_name,"half");
                          if (iVar3 != 0) {
                            iVar3 = strcmp(function_name,"lisbon");
                            if (iVar3 != 0) {
                              iVar3 = strcmp(function_name,"fp-sa");
                              if (iVar3 != 0) {
                                iVar3 = strcmp(function_name,"trig");
                                if (iVar3 != 0) {
                                  printf("%s: %d: %s %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                         ,0x181,"unknown user function",function_name);
                                  return 5;
                                }
                                ref_acceptance_primal_trig(RVar14,dVar12,&local_68);
                                dVar13 = local_48;
                                dVar15 = local_68;
                                dVar12 = local_50 * local_50 +
                                         local_60 * local_60 + local_58 * local_58;
                                if (dVar12 < 0.0) {
                                  dVar12 = sqrt(dVar12);
                                }
                                else {
                                  dVar12 = SQRT(dVar12);
                                }
                                dVar15 = (dVar13 * 1.4) / dVar15;
                                if (dVar15 < 0.0) {
                                  dVar15 = sqrt(dVar15);
                                }
                                else {
                                  dVar15 = SQRT(dVar15);
                                }
                                RVar14 = dVar12 / dVar15;
                                goto LAB_0011032d;
                              }
                              uVar4 = ref_acceptance_primal_fp_sa(dVar12,&local_68);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c"
                                       ,0x16b,"ref_acceptance_u",(ulong)uVar4,"flat plate sa");
                                return uVar4;
                              }
                              dVar15 = local_50 * local_50 +
                                       local_60 * local_60 + local_58 * local_58;
                              if (dVar15 < 0.0) {
                                dVar15 = sqrt(dVar15);
                              }
                              else {
                                dVar15 = SQRT(dVar15);
                              }
                              goto LAB_00110466;
                            }
                            uVar4 = ref_acceptance_u_lisbon(RVar14,dVar12,&local_68);
                            if (uVar4 == 0) goto LAB_00110957;
                            uVar5 = 0x166;
                            pcVar6 = "lisbon";
                            goto LAB_0011094c;
                          }
                          scalar[lVar7] = 1.0;
                          if (0.5 <= dVar12) goto LAB_0011046c;
                          RVar14 = 0.5;
                        }
                        scalar[lVar7] = RVar14;
                        goto LAB_0011046c;
                      }
                      dVar12 = RVar14 * RVar14 + dVar12 * dVar12;
                      if (dVar12 < 0.0) {
                        dVar12 = sqrt(dVar12);
                      }
                      else {
                        dVar12 = SQRT(dVar12);
                      }
                      uVar4 = ref_phys_spalding_uplus((dVar12 + -0.5) * 10000.0,&local_68);
                      if (uVar4 != 0) {
                        uVar5 = 0x156;
                        goto LAB_0011093b;
                      }
                    }
LAB_00110957:
                    dVar12 = local_68;
                    if (uVar4 != 0) {
                      return local_9c;
                    }
                  }
                  scalar[lVar7] = dVar12;
                  goto LAB_0011046c;
                }
                dVar12 = (dVar15 + -0.4) * (dVar12 + -0.4) * (RVar14 + -0.4);
                if (dVar12 <= -0.0628318530717958) {
                  dVar15 = sin(dVar12 * 50.0);
                }
                else {
                  dVar15 = sin(dVar12 * 50.0);
                  if (dVar12 <= 0.1256637061435916) goto LAB_00110466;
                }
                dVar15 = dVar15 * 0.1;
              }
            }
LAB_00110466:
            scalar[lVar7] = dVar15;
          }
        }
      }
LAB_0011046c:
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xf;
    } while (lVar7 < ref_node->max);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_u(REF_NODE ref_node,
                                           const char *function_name,
                                           REF_DBL *scalar) {
  REF_INT node;
  REF_DBL x, y, z;
  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    y = ref_node_xyz(ref_node, 1, node);
    z = ref_node_xyz(ref_node, 2, node);
    if (strcmp(function_name, "u5") == 0) {
      scalar[node] = 2.0 * pow(x, 2) + 2.0 * pow(y, 2) + 2.0 * pow(z, 2);
    } else if (strcmp(function_name, "supcyl") == 0) {
      REF_DBL r;
      r = sqrt(x * x + y * y) - 0.5;
      scalar[node] = 1.0 - exp(-50.0 * r);
      if ((x - (-1.0)) < 0.5 * y * y) scalar[node] = 2.0;
    } else if (strcmp(function_name, "combo1") == 0) {
      REF_DBL xy, x3;
      xy = (2.0 * x - 1.0) * (2.0 * y - 1.0);
      x3 = pow((2.0 * x - 1.0), 3);
      scalar[node] = tanh(15.0 * xy - x3);
    } else if (strcmp(function_name, "combo2") == 0) {
      REF_DBL xy;
      xy = (2.0 * x - 1.0) * (2.0 * y - 1.0);
      scalar[node] = tanh(50.0 * (xy - 0.5));
    } else if (strcmp(function_name, "sin50xy") == 0) {
      REF_DBL xy;
      xy = (2.0 * x - 1.0) * (2.0 * y - 1.0);
      if (ABS(xy) <= (ref_math_pi / 50.0)) {
        scalar[node] = sin(50.0 * xy);
      } else if (ABS(xy) <= 2.0 * (ref_math_pi / 50.0)) {
        scalar[node] = sin(50.0 * xy);
      } else {
        scalar[node] = 0.01 * sin(50.0 * xy);
      }
    } else if (strcmp(function_name, "sinfun3") == 0) {
      REF_DBL xyz;
      xyz = (x - 0.4) * (y - 0.4) * (z - 0.4); /* sphere2 */
      if (xyz <= (-1.0 * ref_math_pi / 50.0)) {
        scalar[node] = 0.1 * sin(50. * xyz);
      } else if (xyz <= (2.0 * ref_math_pi / 50.0)) {
        scalar[node] = sin(50.0 * xyz);
      } else {
        scalar[node] = 0.1 * sin(50.0 * xyz);
      }
    } else if (strcmp(function_name, "sinatan3") == 0) {
      REF_DBL eps = 0.1;
      REF_DBL xz;
      xz = x * z;
      scalar[node] =
          0.1 * sin(50.0 * xz) + atan(eps / (sin(5.0 * y) - 2.0 * xz));
    } else if (strcmp(function_name, "tanh3") == 0) {
      scalar[node] = tanh(pow(x + 1.3, 20.0) * pow(y - 0.3, 9.0) * z);
    } else if (strcmp(function_name, "bl3") == 0) {
      REF_DBL f, g, h;
      REF_DBL a = 1.0;
      REF_DBL b = 1.0;
      REF_DBL c = 1.0;
      REF_DBL nu = 0.01;
      REF_DBL scale = -1;
      REF_DBL offset = 1;
      f = (1.0 - exp(-a * (1.0 - x) / nu)) / (1.0 - exp(-a / nu));
      g = (1.0 - exp(-b * (1.0 - y) / nu)) / (1.0 - exp(-b / nu));
      h = (1.0 - exp(-c * (1.0 - z) / nu)) / (1.0 - exp(-c / nu));
      scalar[node] = scale * f * g * h + offset;
    } else if (strcmp(function_name, "uplus") == 0) {
      REF_DBL uplus, yplus, scale;
      scale = 1.0e4;
      yplus = scale * y;
      RSS(ref_phys_spalding_uplus(yplus, &uplus), "uplus");
      scalar[node] = uplus + 5.0e-4 * x * x;
    } else if (strcmp(function_name, "circgap") == 0) {
      REF_DBL uplus0, uplus1, uplus, combined;
      REF_INT step;
      REF_DBL yplus0, yplus1, gap, r, radius, center, scale, hop;
      radius = 1.0;
      gap = 0.1;
      center = -gap - radius;
      scale = 1.0e4;
      hop = 25.0;
      yplus0 = scale * ABS(y);
      RSS(ref_phys_spalding_uplus(yplus0, &uplus0), "uplus");
      r = sqrt(x * x + (y - center) * (y - center));
      yplus1 = scale * (r - radius);
      RSS(ref_phys_spalding_uplus(yplus1, &uplus1), "uplus");
      uplus = MIN(uplus0, uplus1);
      step = MAX(0, (REF_INT)uplus - 25);
      combined = uplus + hop * (REF_DBL)step;
      scalar[node] = combined;
    } else if (strcmp(function_name, "sphuplus") == 0) {
      REF_DBL x0 = 1, y0 = 1, z0 = 1;
      REF_DBL uplus;
      REF_DBL yplus, r, radius, scale;
      radius = 0.5;
      scale = 1.0e4;
      r = sqrt((x - x0) * (x - x0) + (y - y0) * (y - y0) + (z - z0) * (z - z0));
      yplus = scale * (r - radius);
      RSS(ref_phys_spalding_uplus(yplus, &uplus), "uplus");
      scalar[node] = uplus;
    } else if (strcmp(function_name, "cyluplus") == 0) {
      REF_DBL uplus;
      REF_DBL yplus, r, radius, scale;
      radius = 0.5;
      scale = 1.0e4;
      r = sqrt(x * x + y * y);
      yplus = scale * (r - radius);
      RSS(ref_phys_spalding_uplus(yplus, &uplus), "uplus");
      scalar[node] = uplus;
    } else if (strcmp(function_name, "dist") == 0) {
      REF_DBL r, radius;
      radius = 0.5;
      r = sqrt(x * x + y * y);
      scalar[node] = (r - radius);
    } else if (strcmp(function_name, "parabola") == 0) {
      scalar[node] = tanh(50 * (x - y * y));
    } else if (strcmp(function_name, "one") == 0) {
      scalar[node] = 1.0;
    } else if (strcmp(function_name, "half") == 0) {
      scalar[node] = 1.0;
      if (y < 0.5) scalar[node] = 0.5;
    } else if (strcmp(function_name, "lisbon") == 0) {
      REF_DBL vel;
      RSS(ref_acceptance_u_lisbon(x, y, &vel), "lisbon");
      scalar[node] = vel;
    } else if (strcmp(function_name, "fp-sa") == 0) {
      REF_DBL u, v, w;
      REF_DBL primitive[6];
      RSS(ref_acceptance_primal_fp_sa(y, primitive), "flat plate sa");
      u = primitive[1];
      v = primitive[2];
      w = primitive[3];
      scalar[node] = sqrt(u * u + v * v + w * w);
    } else if (strcmp(function_name, "trig") == 0) {
      REF_DBL rho, pressure, u, v, w, mach;
      REF_DBL primitive[5];
      x = ref_node_xyz(ref_node, 0, node);
      y = ref_node_xyz(ref_node, 1, node);
      RSS(ref_acceptance_primal_trig(ref_node_xyz(ref_node, 0, node),
                                     ref_node_xyz(ref_node, 1, node),
                                     primitive),
          "coax");
      rho = primitive[0];
      u = primitive[1];
      v = primitive[2];
      w = primitive[3];
      pressure = primitive[4];
      mach = sqrt(u * u + v * v + w * w) / sqrt(1.4 * pressure / rho);
      scalar[node] = mach;
    } else {
      printf("%s: %d: %s %s\n", __FILE__, __LINE__, "unknown user function",
             function_name);
      return REF_NOT_FOUND;
    }
  }
  return REF_SUCCESS;
}